

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

MPP_RET put_frame(Kmpp *ctx,MppFrame frame)

{
  RK_S32 RVar1;
  undefined4 local_148;
  undefined4 local_144;
  MppEncROICfgLegacy roi_data0;
  MppEncROICfg *roi_data;
  MppPacket packet;
  MppMeta meta;
  MppBuffer pvStack_a0;
  MPP_RET ret;
  MppBuffer buf;
  KmppFrameInfos frame_info;
  MppFrame frame_local;
  Kmpp *ctx_local;
  
  pvStack_a0 = (MppBuffer)0x0;
  meta._4_4_ = 0;
  if (ctx == (Kmpp *)0x0) {
    ctx_local._4_4_ = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    ctx_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    frame_info._112_8_ = frame;
    pvStack_a0 = mpp_frame_get_buffer(frame);
    memset(&buf,0,0x78);
    buf._0_4_ = mpp_frame_get_width((MppFrame)frame_info._112_8_);
    buf._4_4_ = mpp_frame_get_height((MppFrame)frame_info._112_8_);
    frame_info.width = mpp_frame_get_hor_stride((MppFrame)frame_info._112_8_);
    frame_info.height = mpp_frame_get_ver_stride((MppFrame)frame_info._112_8_);
    frame_info.hor_stride = mpp_frame_get_hor_stride_pixel((MppFrame)frame_info._112_8_);
    frame_info.ver_stride = mpp_frame_get_offset_x((MppFrame)frame_info._112_8_);
    frame_info.hor_stride_pixel = mpp_frame_get_offset_y((MppFrame)frame_info._112_8_);
    frame_info.offset_x = mpp_frame_get_fmt((MppFrame)frame_info._112_8_);
    frame_info.offset_y = mpp_buffer_get_fd_with_caller(pvStack_a0,"put_frame");
    RVar1 = mpp_frame_has_meta((MppFrame)frame_info._112_8_);
    if (RVar1 != 0) {
      packet = mpp_frame_get_meta((MppFrame)frame_info._112_8_);
      roi_data = (MppEncROICfg *)0x0;
      mpp_meta_get_packet(packet,KEY_OUTPUT_PACKET,&roi_data);
      ctx->mPacket = roi_data;
      roi_data0.regions[7].intra = 0;
      roi_data0.regions[7].quality = 0;
      roi_data0.regions[7].qp_area_idx = 0;
      roi_data0.regions[7].area_map_en = '\0';
      roi_data0.regions[7].abs_qp_en = '\0';
      mpp_meta_get_ptr(packet,KEY_ROI_DATA,(void **)&roi_data0.regions[7].intra);
      if (roi_data0.regions[7]._8_8_ != 0) {
        local_148 = 1;
        local_144 = *(undefined4 *)roi_data0.regions[7]._8_8_;
        memcpy(&roi_data0,*(void **)(roi_data0.regions[7]._8_8_ + 8),
               (ulong)*(uint *)roi_data0.regions[7]._8_8_ << 4);
        (*ctx->mApi->control)(ctx,MPP_ENC_SET_ROI_CFG,&local_148);
      }
    }
    meta._4_4_ = mpp_vcodec_ioctl(ctx->mClientFd,0x400,0,0x78,&buf);
    if (meta._4_4_ != MPP_OK) {
      _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_IN_FRM_RDY failed\n",(char *)0x0,
                 (ulong)(uint)ctx->mChanId);
    }
    ctx_local._4_4_ = meta._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET put_frame(Kmpp *ctx, MppFrame frame)
{
    KmppFrameInfos frame_info;
    MppBuffer buf = NULL;
    MPP_RET ret = MPP_OK;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    buf = mpp_frame_get_buffer(frame);
    memset(&frame_info, 0, sizeof(frame_info));
    frame_info.width = mpp_frame_get_width(frame);
    frame_info.height = mpp_frame_get_height(frame);
    frame_info.hor_stride = mpp_frame_get_hor_stride(frame);
    frame_info.ver_stride = mpp_frame_get_ver_stride(frame);
    frame_info.hor_stride_pixel = mpp_frame_get_hor_stride_pixel(frame);
    frame_info.offset_x = mpp_frame_get_offset_x(frame);
    frame_info.offset_y = mpp_frame_get_offset_y(frame);
    frame_info.fmt = mpp_frame_get_fmt(frame);
    frame_info.fd = mpp_buffer_get_fd(buf);
    // frame_info.pts = mpp_frame_get_pts(frame);
    // frame_info.jpeg_chan_id = mpp_frame_get_jpege_chan_id(frame);
    // frame_info.eos = mpp_frame_get_eos(frame);
    // frame_info.pskip = mpp_frame_get_pskip_request(frame);
    // frame_info.pskip_num = mpp_frame_get_pskip_num(frame);
    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        ctx->mPacket = packet;

        /* set roi */
        {
            MppEncROICfg *roi_data = NULL;
            MppEncROICfgLegacy roi_data0;

            mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void**)&roi_data);
            if (roi_data) {
                roi_data0.change = 1;
                roi_data0.number = roi_data->number;
                memcpy(roi_data0.regions, roi_data->regions, roi_data->number * sizeof(MppEncROIRegion));
                ctx->mApi->control(ctx, MPP_ENC_SET_ROI_CFG, &roi_data0);
            }
        }
    }

    ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_IN_FRM_RDY, 0, sizeof(frame_info), &frame_info);
    if (ret)
        mpp_err("chan %d VCODEC_CHAN_IN_FRM_RDY failed\n", ctx->mChanId);

    return ret;
}